

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Boolean MA_allocate_heap(Integer datatype,Integer nelem,char *name,Integer *memhandle)

{
  Pointer pcVar1;
  AD *ad;
  ulong uVar2;
  Integer IVar3;
  ulong uVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  int maxchars;
  char *__format;
  Pointer client_space;
  ulongi nbytes;
  AR ar;
  
  ma_stats.calls[1] = ma_stats.calls[1] + 1;
  if (ma_trace != 0) {
    printf("MA: allocating \'%s\' (%d)\n",name,nelem & 0xffffffff);
  }
  if (ma_initialized == '\0') {
    sprintf(ma_ebuf,"block \'%s\', MA not yet initialized",name);
  }
  else {
    uVar4 = datatype - 1000;
    if (uVar4 < 0x11) {
      if (nelem < 0) {
        sprintf(ma_ebuf,"block \'%s\', invalid nelem: %ld",name,nelem);
        goto LAB_00155652;
      }
      ar.datatype = uVar4;
      ar.nelem = nelem;
      ad = list_delete_one(&ma_hfree,ad_big_enough,(Pointer)&ar);
      pcVar1 = ma_hp;
      maxchars = extraout_EDX;
      if (ad != (AD *)0x0) {
LAB_001556a9:
        ad->datatype = uVar4;
        ad->nelem = nelem;
        str_ncopy(ad->name,name,maxchars);
        ad->next = ma_hused;
        ma_hused = ad;
        ad->checksum = (ulongi)(ad->client_space + ad->nbytes + ad->nelem + ad->datatype);
        guard_set(ad);
        if (ma_hp < ad->name + (ad->nbytes - 0x10)) {
          ma_hp = ad->name + (ad->nbytes - 0x10);
        }
        ma_stats.hblocks = ma_stats.hblocks + 1;
        uVar4 = ma_stats.hblocks;
        if (ma_stats.hblocks < ma_stats.hblocks_max) {
          uVar4 = ma_stats.hblocks_max;
        }
        ma_stats.hbytes = ad->nbytes + ma_stats.hbytes;
        uVar2 = ma_stats.hbytes;
        if (ma_stats.hbytes < ma_stats.hbytes_max) {
          uVar2 = ma_stats.hbytes_max;
        }
        ma_stats.hblocks_max = uVar4;
        ma_stats.hbytes_max = uVar2;
        IVar3 = ma_table_allocate((TableData)ad);
        *memhandle = IVar3;
        return (ulong)(IVar3 != -1);
      }
      balloc_after(&ar,ma_hp,&client_space,&nbytes);
      if (pcVar1 + nbytes <= ma_sp) {
        *(Pointer *)(pcVar1 + 0x30) = client_space;
        *(ulongi *)(pcVar1 + 0x38) = nbytes;
        ad = (AD *)pcVar1;
        maxchars = extraout_EDX_00;
        goto LAB_001556a9;
      }
      __format = "block \'%s\', not enough space to allocate %lu bytes";
    }
    else {
      __format = "block \'%s\', invalid datatype: %ld";
      nbytes = datatype;
    }
    sprintf(ma_ebuf,__format,name,nbytes);
  }
LAB_00155652:
  ma_error(EL_Nonfatal,ET_External,"MA_allocate_heap",ma_ebuf);
  return 0;
}

Assistant:

public Boolean MA_allocate_heap(
    Integer    datatype,    /* of elements in this block */
    Integer    nelem,        /* # of elements in this block */
    const char    *name,        /* assigned to this block by client */
    Integer    *memhandle    /* RETURN: handle for this block */ )
{
    AR        ar;        /* allocation request */
    AD        *ad;        /* AD for newly allocated block */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for ar */
    Pointer    new_hp;        /* new ma_hp */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_allocate_heap]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    if (ma_trace) 
    (void)printf("MA: allocating '%s' (%d)\n", name, (int)nelem);

    /* verify initialization */
    if (!ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', MA not yet initialized",
            name);
        ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
        return MA_FALSE;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid datatype: %ld",
            name, (size_t)datatype);
        ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
        return MA_FALSE;
    }

    /* verify nelem */
    if (nelem < 0)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid nelem: %ld",
            name, (size_t)nelem);
        ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
        return MA_FALSE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /*
     * attempt to allocate space
     */

    ar.datatype = datatype;
    ar.nelem = nelem;

    /* search the free list */
    ad = list_delete_one(&ma_hfree, ad_big_enough, (Pointer)&ar);

    /* if search of free list failed, try expanding heap region */
    if (ad == (AD *)NULL)
    {
        /* perform trial allocation to determine size */
        balloc_after(&ar, ma_hp, &client_space, &nbytes);

        new_hp = ma_hp + nbytes;
        if (new_hp > ma_sp)
        {
            (void)sprintf(ma_ebuf,
                "block '%s', not enough space to allocate %lu bytes",
                name, nbytes);
            ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
            return MA_FALSE;
        }
        else
        {
            /* heap region expanded successfully */
            ad = (AD *)ma_hp;

            /* set fields appropriately */
            ad->client_space = client_space;
            ad->nbytes = nbytes;
        }
    }

    /*
     * space has been allocated
     */

    /* initialize the AD */
    ad->datatype = datatype;
    ad->nelem = nelem;
    str_ncopy(ad->name, (char*)name, MA_NAMESIZE);
    /* ad->client_space is already set */
    /* ad->nbytes is already set */
    list_insert(ad, &ma_hused);
    ad->checksum = checksum(ad);

    /* set the guards */
    guard_set(ad);

#ifdef DEBUG
    debug_ad_print(ad);
#endif /* DEBUG */

    /* update ma_hp if necessary */
    new_hp = (Pointer)ad + ad->nbytes;
    if (new_hp > ma_hp)
    {
        ma_hp = new_hp;
    }

#ifdef STATS
    ma_stats.hblocks++;
    ma_stats.hblocks_max = max(ma_stats.hblocks, ma_stats.hblocks_max);
    ma_stats.hbytes += ad->nbytes;
    ma_stats.hbytes_max = max(ma_stats.hbytes, ma_stats.hbytes_max);
#endif /* STATS */

    /* convert AD to memhandle */
    if ((*memhandle = ma_table_allocate((TableData)ad)) == TABLE_HANDLE_NONE)
        /* failure */
        return MA_FALSE;
    else
        /* success */
        return MA_TRUE;
}